

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLayerNormalizationWrongGammaOrBeta(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  LayerNormalizationLayerParams *this_01;
  WeightParams *pWVar6;
  string *psVar7;
  long lVar8;
  ostream *poVar9;
  undefined1 local_130 [8];
  Result res4;
  undefined1 local_e0 [8];
  Result res2;
  LayerNormalizationLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_layernormalization(this_00);
  CoreML::Specification::LayerNormalizationLayerParams::add_normalizedshape(this_01,1);
  pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
  pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_01);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
  pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
  CoreML::Specification::WeightParams::mutable_quantization(pWVar6);
  CoreML::validate<(MLModelType)500>((Result *)&res2.m_message._M_storage,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)&res2.m_message._M_storage);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x170c);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"!((res1).good())");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
    res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
  }
  else {
    psVar7 = CoreML::Result::message_abi_cxx11_((Result *)&res2.m_message._M_storage);
    lVar8 = std::__cxx11::string::find((char *)psVar7,0x43ce07);
    if (lVar8 == -1) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x170d);
      poVar9 = std::operator<<(poVar9,": error: ");
      poVar9 = std::operator<<(poVar9,"res1.message().find(\"quantized\") != std::string::npos");
      poVar9 = std::operator<<(poVar9," was false, expected true.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
      res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
    }
    else {
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
      CoreML::Specification::WeightParams::clear_floatvalue(pWVar6);
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
      CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_01);
      CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_01);
      CoreML::Specification::WeightParams::mutable_quantization(pWVar6);
      CoreML::validate<(MLModelType)500>((Result *)local_e0,(Model *)&in);
      bVar1 = CoreML::Result::good((Result *)local_e0);
      if (bVar1) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1715);
        poVar9 = std::operator<<(poVar9,": error: ");
        poVar9 = std::operator<<(poVar9,"!((res2).good())");
        poVar9 = std::operator<<(poVar9," was false, expected true.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
        res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
      }
      else {
        psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_e0);
        lVar8 = std::__cxx11::string::find((char *)psVar7,0x43ce07);
        if (lVar8 == -1) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1716);
          poVar9 = std::operator<<(poVar9,": error: ");
          poVar9 = std::operator<<(poVar9,"res2.message().find(\"quantized\") != std::string::npos")
          ;
          poVar9 = std::operator<<(poVar9," was false, expected true.");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
          res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
        }
        else {
          pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
          CoreML::Specification::WeightParams::clear_quantization(pWVar6);
          pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_01);
          CoreML::Specification::WeightParams::clear_quantization(pWVar6);
          pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
          CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
          CoreML::validate<(MLModelType)500>
                    ((Result *)&res4.m_message.super__Rb_tree_node_base._M_right,(Model *)&in);
          bVar1 = CoreML::Result::good((Result *)&res4.m_message.super__Rb_tree_node_base._M_right);
          if (bVar1) {
            poVar9 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar9 = std::operator<<(poVar9,":");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x171f);
            poVar9 = std::operator<<(poVar9,": error: ");
            poVar9 = std::operator<<(poVar9,"!((res3).good())");
            poVar9 = std::operator<<(poVar9," was false, expected true.");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            m._oneof_case_[0] = 1;
            res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
          }
          else {
            psVar7 = CoreML::Result::message_abi_cxx11_
                               ((Result *)&res4.m_message.super__Rb_tree_node_base._M_right);
            lVar8 = std::__cxx11::string::find((char *)psVar7,0x43ce7d);
            if (lVar8 == -1) {
              poVar9 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar9 = std::operator<<(poVar9,":");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1720);
              poVar9 = std::operator<<(poVar9,": error: ");
              poVar9 = std::operator<<(poVar9,
                                       "res3.message().find(\"Shape of gamma\") != std::string::npos"
                                      );
              poVar9 = std::operator<<(poVar9," was false, expected true.");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              m._oneof_case_[0] = 1;
              res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
            }
            else {
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
              CoreML::Specification::WeightParams::clear_floatvalue(pWVar6);
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_01);
              CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_01);
              CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_01);
              CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
              CoreML::validate<(MLModelType)500>((Result *)local_130,(Model *)&in);
              bVar1 = CoreML::Result::good((Result *)local_130);
              if (bVar1) {
                poVar9 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar9 = std::operator<<(poVar9,":");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1728);
                poVar9 = std::operator<<(poVar9,": error: ");
                poVar9 = std::operator<<(poVar9,"!((res4).good())");
                poVar9 = std::operator<<(poVar9," was false, expected true.");
                std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                m._oneof_case_[0] = 1;
              }
              else {
                psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_130);
                lVar8 = std::__cxx11::string::find((char *)psVar7,0x43cec7);
                if (lVar8 == -1) {
                  poVar9 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar9 = std::operator<<(poVar9,":");
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1729);
                  poVar9 = std::operator<<(poVar9,": error: ");
                  poVar9 = std::operator<<(poVar9,
                                           "res4.message().find(\"Shape of beta\") != std::string::npos"
                                          );
                  poVar9 = std::operator<<(poVar9," was false, expected true.");
                  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                  m._oneof_case_[0] = 1;
                }
                else {
                  m._oneof_case_[0] = 0;
                }
              }
              res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
              CoreML::Result::~Result((Result *)local_130);
            }
          }
          CoreML::Result::~Result((Result *)&res4.m_message.super__Rb_tree_node_base._M_right);
        }
      }
      CoreML::Result::~Result((Result *)local_e0);
    }
  }
  CoreML::Result::~Result((Result *)&res2.m_message._M_storage);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLayerNormalizationWrongGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_gamma()->mutable_quantization();

    // value of gamma and beta should be unquantized
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("quantized") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->mutable_quantization();

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("quantized") != std::string::npos);

    // shape of gamma and beta should be match normalized shape

    params->mutable_gamma()->clear_quantization();
    params->mutable_beta()->clear_quantization();
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Shape of gamma") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Shape of beta") != std::string::npos);

    return 0;
}